

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O1

void __thiscall license::CommandLineParser::~CommandLineParser(CommandLineParser *this)

{
  operator_delete(this);
  return;
}

Assistant:

static bool rerunBoostPO(const po::parsed_options &parsed, const po::options_description &project_desc,
						 po::variables_map &vm, const char **argv, const std::string &command_for_logging,
						 const po::options_description &global) {
	// Collect all the unrecognized options from the first pass. This will include the
	// (positional) command name, so we need to erase that.
	// Parse again...
	bool cont = false;
	std::vector<std::string> opts = po::collect_unrecognized(parsed.options, po::include_positional);
	opts.erase(opts.begin());
	po::store(po::command_line_parser(opts).options(project_desc).run(), vm);
	if (vm.find("help") == vm.end()) {
		try {
			po::notify(vm);
			cont = true;
		} catch (std::exception &e) {
			printHelpHeader(argv[0]);
			cout << argv[0] << command_for_logging << " [options]" << endl;
			global.print(cout);
			project_desc.print(cout);
			std::cerr << "Error: " << e.what() << endl;
		}
	} else {
		printHelpHeader(argv[0]);
		cout << argv[0] << command_for_logging << " [options]" << endl;
		global.print(cout);
		project_desc.print(cout);
	}
	return cont;
}